

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
::allocate_new_page(heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                    *this)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  ControlBlock *control_block;
  
  pCVar1 = this->m_tail;
  if (pCVar1 == (ControlBlock *)0xffef) {
    pCVar2 = (ControlBlock *)
             basic_default_allocator<65536UL>::allocate_page
                       ((basic_default_allocator<65536UL> *)this);
    this->m_head = pCVar2;
  }
  else {
    pCVar1->m_next = 0;
    pCVar2 = (ControlBlock *)
             basic_default_allocator<65536UL>::allocate_page
                       ((basic_default_allocator<65536UL> *)this);
    pCVar1->m_next = (uintptr_t)((long)&pCVar2->m_next + 2);
  }
  this->m_tail = pCVar2;
  return;
}

Assistant:

DENSITY_NO_INLINE void allocate_new_page()
        {
            // page overflow
            if (DENSITY_LIKELY(m_tail != reinterpret_cast<ControlBlock *>(s_invalid_control_block)))
            {
                auto const control_block = m_tail;

                DENSITY_ASSUME(control_block != nullptr);
                new (control_block) ControlBlock();

                auto new_page         = allocator_type::allocate_page();
                control_block->m_next = reinterpret_cast<uintptr_t>(new_page) + detail::Queue_Dead;
                m_tail                = static_cast<ControlBlock *>(new_page);
            }
            else
            {
                // this happens only on a virgin queue
                m_tail = m_head = static_cast<ControlBlock *>(allocator_type::allocate_page());
            }
        }